

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
::val(FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ::exp(-((((this->left_->fadexpr_).expr_)->fadexpr_).expr_.fadexpr_.expr_)->val_);
  dVar2 = ::exp((this->right_->fadexpr_).expr_.val_);
  return dVar2 - dVar1;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}